

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

Real __thiscall amrex::MLMG::MLResNormInf(MLMG *this,int alevmax,bool local)

{
  double *pdVar1;
  byte in_DL;
  int in_ESI;
  double *in_RDI;
  int alev;
  Real r;
  MPI_Comm in_stack_ffffffffffffffcc;
  Real in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  double local_18;
  byte local_d;
  int local_c;
  
  local_d = in_DL & 1;
  local_18 = 0.0;
  local_c = in_ESI;
  for (iVar2 = 0; iVar2 <= local_c; iVar2 = iVar2 + 1) {
    in_stack_ffffffffffffffd8 =
         ResNormInf((MLMG *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                    (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x18,0));
    pdVar1 = std::max<double>(&local_18,(double *)&stack0xffffffffffffffd8);
    local_18 = *pdVar1;
  }
  if ((local_d & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>(in_RDI,in_stack_ffffffffffffffcc);
  }
  return local_18;
}

Assistant:

Real
MLMG::MLResNormInf (int alevmax, bool local)
{
    BL_PROFILE("MLMG::MLResNormInf()");
    Real r = 0.0;
    for (int alev = 0; alev <= alevmax; ++alev)
    {
        r = std::max(r, ResNormInf(alev,true));
    }
    if (!local) ParallelAllReduce::Max(r, ParallelContext::CommunicatorSub());
    return r;
}